

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.h
# Opt level: O3

size_t bitset_next_set_bits(bitset_t *bitset,size_t *buffer,size_t capacity,size_t *startfrom)

{
  uint64_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  uint64_t uVar6;
  
  if (capacity != 0) {
    uVar4 = *startfrom;
    sVar5 = uVar4 >> 6;
    if (sVar5 < bitset->arraysize) {
      puVar1 = bitset->array;
      uVar6 = (puVar1[sVar5] >> ((byte)uVar4 & 0x3f)) << ((byte)uVar4 & 0x3f);
      uVar4 = uVar4 & 0xffffffffffffffc0;
      uVar2 = 0;
      do {
        while (uVar6 == 0) {
          sVar5 = sVar5 + 1;
          uVar3 = uVar2;
          if (sVar5 == bitset->arraysize) goto LAB_00110261;
          uVar4 = uVar4 + 0x40;
          uVar6 = puVar1[sVar5];
          if (capacity <= uVar2) goto LAB_00110261;
        }
        uVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        buffer[uVar2] = uVar3 | uVar4;
        uVar2 = uVar2 + 1;
        uVar6 = uVar6 & uVar6 - 1;
        uVar3 = capacity;
      } while (capacity != uVar2);
LAB_00110261:
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        *startfrom = buffer[uVar3 - 1];
      }
      return uVar3;
    }
  }
  return 0;
}

Assistant:

inline size_t bitset_next_set_bits(const bitset_t *bitset, size_t *buffer,
                                   size_t capacity, size_t *startfrom) {
    if (capacity == 0) return 0;  // sanity check
    size_t x = *startfrom / 64;
    if (x >= bitset->arraysize) {
        return 0;  // nothing more to iterate over
    }
    uint64_t w = bitset->array[x];
    // unset low bits inside the word less than *startfrom
    w &= ~((UINT64_C(1) << (*startfrom & 63)) - 1);
    size_t howmany = 0;
    size_t base = x << 6;
    while (howmany < capacity) {
        while (w != 0) {
            uint64_t t = w & (~w + 1);
            int r = roaring_trailing_zeroes(w);
            buffer[howmany++] = r + base;
            if (howmany == capacity) goto end;
            w ^= t;
        }
        x += 1;
        if (x == bitset->arraysize) {
            break;
        }
        base += 64;
        w = bitset->array[x];
    }
end:
    if (howmany > 0) {
        *startfrom = buffer[howmany - 1];
    }
    return howmany;
}